

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shutdown.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *__nptr;
  char socket_address [128];
  char acStack_88 [128];
  
  if (argc < 2) {
    __nptr = "5555";
  }
  else {
    __nptr = argv[1];
  }
  uVar1 = atoi(__nptr);
  sprintf(acStack_88,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar1);
  iVar2 = nn_socket(1,0x30);
  if (iVar2 == -1) {
LAB_0010150b:
    main_cold_4();
  }
  else {
    iVar3 = nn_connect(iVar2,acStack_88);
    if (-1 < iVar3) {
      iVar3 = nn_shutdown(iVar2,iVar3);
      if (iVar3 == 0) {
        iVar2 = nn_close(iVar2);
        if (iVar2 == 0) {
          return 0;
        }
        piVar4 = __errno_location();
        if (*piVar4 == 9) {
          return 0;
        }
        if (*piVar4 == 0x9523dfd) {
          return 0;
        }
        goto LAB_00101518;
      }
      main_cold_1();
      goto LAB_0010150b;
    }
  }
  main_cold_3();
LAB_00101518:
  main_cold_2();
}

Assistant:

int main (int argc, const char *argv[])
{
    int s;
    int rc;
    int eid;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    /*  Run endpoint shutdown and socket shutdown in parallel. */
    s = test_socket (AF_SP, NN_REQ);
    eid = test_connect (s, socket_address);
    rc = nn_shutdown (s, eid);
    errno_assert (rc == 0);
    test_close (s);

    return 0;
}